

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t duckdb::ParquetCrypto::Read
                   (TBase *object,TProtocol *iprot,string *key,EncryptionUtil *encryption_util_p)

{
  undefined8 this;
  AllocatedData all;
  TCompactProtocolFactoryT<duckdb::SimpleReadTransport> tsimple_proto_factory;
  TCompactProtocolFactoryT<duckdb::DecryptionTransport> tproto_factory;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> simple_prot;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> dprot;
  undefined1 local_c8 [32];
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_a8;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  uchar *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  uchar *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  Allocator *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_98.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_027dd990;
  local_98.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  make_shared<duckdb::DecryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            ((TProtocol *)local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iprot,
             (EncryptionUtil *)key);
  local_48 = (Allocator *)local_c8._0_8_;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  local_c8._0_8_ = (DecryptionTransport *)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::DecryptionTransport> *)local_78,&local_98);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)local_c8,
               (__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)(local_78._0_8_ + 8));
  this = local_c8._0_8_;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  DecryptionTransport::ReadAll((AllocatedData *)local_c8,(DecryptionTransport *)this);
  local_a8.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_027dde00;
  local_a8.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  ::std::make_shared<duckdb::SimpleReadTransport,unsigned_char*,unsigned_long>
            (&local_68,(unsigned_long *)&local_28);
  local_58 = local_68;
  _Stack_50._M_pi = _Stack_60._M_pi;
  local_68 = (uchar *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::SimpleReadTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::SimpleReadTransport> *)local_88,&local_a8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  (*object->_vptr_TBase[2])(object,local_88._0_8_);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_a8);
  AllocatedData::~AllocatedData((AllocatedData *)local_c8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_98);
  return local_c8._16_4_ + 0x20;
}

Assistant:

uint32_t ParquetCrypto::Read(TBase &object, TProtocol &iprot, const string &key,
                             const EncryptionUtil &encryption_util_p) {
	TCompactProtocolFactoryT<DecryptionTransport> tproto_factory;
	auto dprot = tproto_factory.getProtocol(std::make_shared<DecryptionTransport>(iprot, key, encryption_util_p));
	auto &dtrans = reinterpret_cast<DecryptionTransport &>(*dprot->getTransport());

	// We have to read the whole thing otherwise thrift throws an error before we realize we're decryption is wrong
	auto all = dtrans.ReadAll();
	TCompactProtocolFactoryT<SimpleReadTransport> tsimple_proto_factory;
	auto simple_prot =
	    tsimple_proto_factory.getProtocol(std::make_shared<SimpleReadTransport>(all.get(), all.GetSize()));

	// Read the object
	object.read(simple_prot.get());

	return ParquetCrypto::LENGTH_BYTES + ParquetCrypto::NONCE_BYTES + all.GetSize() + ParquetCrypto::TAG_BYTES;
}